

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_double<double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          double value,format_specs *spec)

{
  byte bVar1;
  alignment aVar2;
  char *pcVar3;
  type pcVar4;
  char cVar5;
  char *str;
  float_spec_handler handler;
  align_spec as;
  write_inf_or_nan_t write_inf_or_nan;
  double_writer local_258;
  memory_buffer buffer;
  
  handler.type = (spec->super_core_format_specs).type;
  handler.upper = false;
  internal::handle_float_type_spec<fmt::v5::float_spec_handler&>(handler.type,&handler);
  if ((long)value < 0) {
    value = (double)((ulong)value ^ (ulong)DAT_00137020);
    cVar5 = '-';
  }
  else {
    bVar1 = (spec->super_core_format_specs).flags;
    if ((bVar1 & 1) == 0) {
      cVar5 = '\0';
    }
    else {
      cVar5 = '+';
      if ((bVar1 & 2) == 0) {
        cVar5 = ' ';
      }
    }
  }
  write_inf_or_nan.spec.super_align_spec.width_ = (spec->super_align_spec).width_;
  write_inf_or_nan.spec.super_align_spec.fill_ = (spec->super_align_spec).fill_;
  write_inf_or_nan.spec._8_8_ = *(undefined8 *)&(spec->super_align_spec).align_;
  write_inf_or_nan.spec.super_core_format_specs.flags = (spec->super_core_format_specs).flags;
  write_inf_or_nan.spec.super_core_format_specs.type = (spec->super_core_format_specs).type;
  write_inf_or_nan.writer = this;
  write_inf_or_nan.sign = cVar5;
  if (NAN(value)) {
    pcVar3 = "NAN";
    str = "nan";
LAB_0011053d:
    if (handler.upper != false) {
      str = pcVar3;
    }
    write_double<double>::write_inf_or_nan_t::operator()(&write_inf_or_nan,str);
    return;
  }
  if (INFINITY <= value) {
    pcVar3 = "INF";
    str = "inf";
    goto LAB_0011053d;
  }
  buffer.super_basic_buffer<char>.ptr_ = buffer.store_;
  buffer.super_basic_buffer<char>.size_ = 0;
  buffer.super_basic_buffer<char>._vptr_basic_buffer = (_func_int **)&PTR_grow_00156010;
  buffer.super_basic_buffer<char>.capacity_ = 500;
  internal::sprintf_format<double>
            (value,&buffer.super_basic_buffer<char>,
             (core_format_specs)
             ((ulong)spec->super_core_format_specs & 0xffff00ffffffffff |
             (ulong)(byte)handler.type << 0x28));
  local_258.n = buffer.super_basic_buffer<char>.size_;
  as.align_ = (spec->super_align_spec).align_;
  as.width_ = (spec->super_align_spec).width_;
  as.fill_ = (spec->super_align_spec).fill_;
  aVar2 = (spec->super_align_spec).align_;
  if (aVar2 == ALIGN_DEFAULT) {
    as.align_ = ALIGN_RIGHT;
  }
  else if (aVar2 == ALIGN_NUMERIC) {
    if (cVar5 != '\0') {
      pcVar4 = internal::reserve<fmt::v5::internal::basic_buffer<char>>(&this->out_,1);
      *pcVar4 = cVar5;
      if (as.width_ != 0) {
        as.width_ = as.width_ - 1;
      }
    }
    as.align_ = ALIGN_RIGHT;
    cVar5 = '\0';
    goto LAB_001105ff;
  }
  local_258.n = (buffer.super_basic_buffer<char>.size_ + 1) - (ulong)(cVar5 == '\0');
LAB_001105ff:
  local_258.sign = cVar5;
  local_258.buffer = &buffer.super_basic_buffer<char>;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::double_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *)this
             ,&as,&local_258);
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(&buffer);
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler handler(static_cast<char>(spec.type));
  internal::handle_float_type_spec(handler.type, handler);

  char sign = 0;
  // Use signbit instead of value < 0 because the latter is always
  // false for NaN.
  if (std::signbit(value)) {
    sign = '-';
    value = -value;
  } else if (spec.has(SIGN_FLAG)) {
    sign = spec.has(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(spec, inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  memory_buffer buffer;
  bool use_grisu = FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      spec.type != 'a' && spec.type != 'A' &&
      internal::grisu2_format(static_cast<double>(value), buffer, spec);
  if (!use_grisu) {
    format_specs normalized_spec(spec);
    normalized_spec.type = handler.type;
    internal::sprintf_format(value, buffer, normalized_spec);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = static_cast<char_type>(sign);
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(as, double_writer{n, sign, buffer});
}